

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YuvImageProcessor.cpp
# Opt level: O3

void MMXProcessor(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  char (*pacVar4) [1920];
  char cVar5;
  char cVar6;
  uint uVar8;
  ushort uVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  long lVar16;
  long lVar17;
  int j;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int iVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM6 [16];
  int iVar7;
  
  uVar13 = 0xffffffffffffffff;
  if (-1 < (long)size) {
    uVar13 = (long)size * 8;
  }
  pvVar3 = operator_new__(uVar13);
  auVar2 = _DAT_00103200;
  pacVar4 = y;
  uVar13 = 0;
  pvVar11 = pvVar3;
  do {
    uVar14 = uVar13 >> 1 & 0x7fffffff;
    uVar18 = 0;
    do {
      uVar20 = uVar18 >> 1 & 0x7fffffff;
      uVar27 = (ulong)CONCAT24((byte)v[uVar14][uVar20] - 0x80,
                               CONCAT22((byte)u[uVar14][uVar20] - 0x80,
                                        (byte)(*pacVar4)[uVar18] - 0x10));
      uVar23 = pmaddwd(uVar27,0x204012a);
      uVar20 = pmaddwd(uVar27,0x1990000012a);
      uVar27 = pmaddwd(uVar27,0xff30ff9c012a);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar20;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar27;
      auVar1 = vpunpcklqdq_avx(auVar28,auVar30);
      auVar28 = vpunpckldq_avx(auVar28,auVar30);
      auVar1 = vpshufb_avx(auVar1,auVar2);
      auVar1 = vpaddd_avx(auVar28,auVar1);
      uVar21 = movdq2q(uVar20,auVar1);
      uVar19 = (int)uVar21 + 0x80 >> 8;
      iVar22 = (int)((ulong)uVar21 >> 0x20) + 0x80 >> 8;
      uVar8 = 0xff;
      if (uVar19 < 0xff) {
        uVar8 = uVar19;
      }
      uVar9 = (ushort)uVar8;
      if ((int)uVar19 < 0) {
        uVar9 = 0;
      }
      iVar26 = iVar22;
      if (0xffffffffff < CONCAT44(iVar22,uVar19)) {
        iVar26 = 0xff;
      }
      if (iVar22 < 0) {
        iVar26 = 0;
      }
      uVar8 = (int)uVar23 + 0x80 + (int)((ulong)uVar23 >> 0x20) >> 8;
      auVar1 = vpinsrw_avx(ZEXT216(uVar9),iVar26,1);
      if (0xfe < (int)uVar8) {
        uVar8 = 0xff;
      }
      auVar1 = vpinsrw_avx(auVar1,~((int)uVar8 >> 0x1f) & uVar8,2);
      *(long *)((long)pvVar11 + uVar18 * 8) = auVar1._0_8_;
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x780);
    uVar13 = uVar13 + 1;
    pvVar11 = (void *)((long)pvVar11 + 0x3c00);
    pacVar4 = pacVar4 + 1;
  } while (uVar13 != 0x438);
  uVar21 = 0x1900810042;
  lVar10 = 0;
  do {
    uVar13 = lVar10 * 3 + 1U & 0xffffffff;
    lVar12 = 0;
    uVar14 = 0;
    uVar23 = pshufw(uVar13,uVar13,0);
    do {
      uVar13 = 0;
      lVar17 = lVar12;
      do {
        uVar24 = *(undefined8 *)((long)pvVar3 + lVar17 * 8);
        uVar24 = CONCAT26((ushort)((short)((ulong)uVar24 >> 0x30) * (short)((ulong)uVar23 >> 0x30))
                          >> 8,CONCAT24((ushort)((short)((ulong)uVar24 >> 0x20) *
                                                (short)((ulong)uVar23 >> 0x20)) >> 8,
                                        CONCAT22((ushort)((short)((ulong)uVar24 >> 0x10) *
                                                         (short)((ulong)uVar23 >> 0x10)) >> 8,
                                                 (ushort)((short)uVar24 * (short)uVar23) >> 8)));
        uVar18 = pmaddwd(uVar24,uVar21);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar18;
        uVar25 = pmaddwd(uVar24,0xffeeffa20070);
        uVar18 = pmaddwd(uVar24,0x70ffb6ffda);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar18;
        auVar1 = vpunpcklqdq_avx(auVar29,auVar31);
        auVar28 = vpunpckldq_avx(auVar29,auVar31);
        auVar1 = vpshufb_avx(auVar1,auVar2);
        vpaddd_avx(auVar28,auVar1);
        uVar21 = movdq2q(uVar21,in_XMM6);
        iVar22 = (int)((ulong)uVar25 >> 0x20);
        uVar19 = ((int)uVar25 + 0x80 >> 8) + 0x10;
        iVar26 = (iVar22 + 0x80 >> 8) + 0x80;
        uVar8 = 0xff;
        if (uVar19 < 0xff) {
          uVar8 = uVar19;
        }
        cVar5 = (char)uVar8;
        if ((int)uVar19 < 0) {
          cVar5 = '\0';
        }
        iVar7 = iVar26;
        if (0xffffffffff < CONCAT44(iVar26,uVar19)) {
          iVar7 = 0xff;
        }
        cVar6 = (char)iVar7;
        if (iVar26 < 0) {
          cVar6 = '\0';
        }
        iVar26 = (int)uVar25 + 0x80 + iVar22 >> 8;
        iVar22 = 0x7f;
        if (iVar26 < 0x7f) {
          iVar22 = iVar26;
        }
        cVar15 = (char)iVar22 + -0x80;
        if (iVar26 < -0x80) {
          cVar15 = '\0';
        }
        result[lVar10][0][lVar17] = cVar5;
        uVar18 = uVar13 >> 1;
        uVar13 = uVar13 + 1;
        lVar17 = lVar17 + 1;
        lVar16 = (uVar18 & 0x7fffffff) + (ulong)(((uint)(uVar14 >> 1) & 0x7fffffff) * 0x3c0);
        result[lVar10][1][lVar16] = cVar6;
        result[lVar10][2][lVar16] = cVar15;
      } while (uVar13 != 0x780);
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x780;
    } while (uVar14 != 0x438);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x55);
  operator_delete__(pvVar3);
  return;
}

Assistant:

void MMXProcessor() {
    auto *data = new __m64[size];
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            auto yi = (uint8_t) y[i][j];
            auto ui = (uint8_t) u[i / 2][j / 2];
            auto vi = (uint8_t) v[i / 2][j / 2];
            __m64 yuv = _mm_setr_pi16(16, 128, 128, 0);
            yuv = _mm_sub_pi16(_mm_setr_pi16(yi, ui, vi, 0), yuv);
            __m64 r = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 0, 409, 0));
            __m64 g = _mm_madd_pi16(yuv, _mm_setr_pi16(298, -100, -208, 0));
            __m64 b = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 516, 0, 0));
            int rr = (_mm_cvtsi64_si32(r) + int(_mm_cvtm64_si64(r) >> 32));
            int gg = (_mm_cvtsi64_si32(g) + int(_mm_cvtm64_si64(g) >> 32));
            int bb = (_mm_cvtsi64_si32(b) + int(_mm_cvtm64_si64(b) >> 32));
            __m64 val = _mm_setr_pi32(rr, gg);
            val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
            val = _mm_srai_pi32(val, 8);
            int ri = between(_mm_cvtsi64_si32(val));
            int gi = between(int(_mm_cvtm64_si64(val)>>32));
            int bi = between((bb + 128) >> 8);
            data[i * width + j] = _mm_setr_pi16(ri, gi, bi, 0);
        }
    }
    for (int num = 0; num < frame_num; num++) {
        int a = num * 3 + 1;
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                int offset = i * width + j;
                __m64 rgb = _mm_srli_pi16(_mm_mullo_pi16(data[offset], _mm_set1_pi16(a)), 8);
                __m64 yi = (_mm_madd_pi16(rgb, _mm_setr_pi16(66, 129, 25, 0)));
                __m64 ui = (_mm_madd_pi16(rgb, _mm_setr_pi16(-38, -74, 112, 0)));
                __m64 vi = (_mm_madd_pi16(rgb, _mm_setr_pi16(112, -94, -18, 0)));
                int yy = (_mm_cvtsi64_si32(yi) + int(_mm_cvtm64_si64(yi) >> 32));
                int uu = (_mm_cvtsi64_si32(ui) + int(_mm_cvtm64_si64(ui) >> 32));
                int vv = (_mm_cvtsi64_si32(vi) + int(_mm_cvtm64_si64(vi) >> 32));
                __m64 val = _mm_setr_pi32(yy, uu);
                val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
                val = _mm_srai_pi32(val, 8);
                val = _mm_add_pi32(val, _mm_setr_pi32(16, 128));
                int ri = between(_mm_cvtsi64_si32(val));
                int gi = between(int(_mm_cvtm64_si64(val)>>32));
                int bi = between(((vv + 128) >> 8) + 128);
                result[num][0][offset] = ri;
                result[num][1][(i / 2) * (width / 2) + j / 2] = gi;
                result[num][2][(i / 2) * (width / 2) + j / 2] = bi;
            }
        }
    }
    delete[] data;
}